

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.cpp
# Opt level: O3

vector<Node,_std::allocator<Node>_> *
generateRandomNodes(vector<Node,_std::allocator<Node>_> *__return_storage_ptr__,size_t n)

{
  pointer pNVar1;
  long lVar2;
  size_t sVar3;
  float fVar4;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_40;
  default_random_engine generator;
  
  local_40._M_x = 1;
  std::vector<Node,_std::allocator<Node>_>::vector
            (__return_storage_ptr__,n,(allocator_type *)((long)&generator._M_x + 3));
  if (n != 0) {
    lVar2 = 0;
    sVar3 = 0;
    do {
      fVar4 = std::
              generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                        (&local_40);
      *(float *)((long)&(((__return_storage_ptr__->super__Vector_base<Node,_std::allocator<Node>_>).
                          _M_impl.super__Vector_impl_data._M_start)->box).left + lVar2) =
           fVar4 + 0.0;
      fVar4 = std::
              generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                        (&local_40);
      pNVar1 = (__return_storage_ptr__->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(float *)((long)&(pNVar1->box).top + lVar2) = fVar4 + 0.0;
      generator._M_x._4_4_ = *(float *)((long)&(pNVar1->box).left + lVar2);
      fVar4 = std::
              generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                        (&local_40);
      fVar4 = fVar4 * 0.01 + 0.0;
      if (1.0 - generator._M_x._4_4_ <= fVar4) {
        fVar4 = 1.0 - generator._M_x._4_4_;
      }
      pNVar1 = (__return_storage_ptr__->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(float *)((long)&(pNVar1->box).width + lVar2) = fVar4;
      generator._M_x._4_4_ = *(float *)((long)&(pNVar1->box).top + lVar2);
      fVar4 = std::
              generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                        (&local_40);
      fVar4 = fVar4 * 0.01 + 0.0;
      if (1.0 - generator._M_x._4_4_ <= fVar4) {
        fVar4 = 1.0 - generator._M_x._4_4_;
      }
      pNVar1 = (__return_storage_ptr__->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(float *)((long)&(pNVar1->box).height + lVar2) = fVar4;
      *(size_t *)((long)&pNVar1->id + lVar2) = sVar3;
      sVar3 = sVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (n != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node> generateRandomNodes(std::size_t n)
{
    auto generator = std::default_random_engine();
    auto originDistribution = std::uniform_real_distribution(0.0f, 1.0f);
    auto sizeDistribution = std::uniform_real_distribution(0.0f, 0.01f);
    auto nodes = std::vector<Node>(n);
    for (auto i = std::size_t(0); i < n; ++i)
    {
        nodes[i].box.left = originDistribution(generator);
        nodes[i].box.top = originDistribution(generator);
        nodes[i].box.width = std::min(1.0f - nodes[i].box.left, sizeDistribution(generator));
        nodes[i].box.height = std::min(1.0f - nodes[i].box.top, sizeDistribution(generator));
        nodes[i].id = i;
    }
    return nodes;
}